

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

JavascriptFunction * __thiscall
Js::JavascriptLibrary::EnsureArrayPrototypeKeysFunction(JavascriptLibrary *this)

{
  Type *this_00;
  bool bVar1;
  RuntimeFunction *ptr;
  
  this_00 = &(this->super_JavascriptLibraryBase).arrayPrototypeKeysFunction;
  if ((this->super_JavascriptLibraryBase).arrayPrototypeKeysFunction.ptr ==
      (JavascriptFunction *)0x0) {
    bVar1 = ScriptContext::IsJsBuiltInEnabled((this->super_JavascriptLibraryBase).scriptContext.ptr)
    ;
    if (bVar1) {
      EnsureBuiltInEngineIsReady
                (Array_prototype,(this->super_JavascriptLibraryBase).scriptContext.ptr);
    }
    else {
      ptr = DefaultCreateFunction
                      (this,(FunctionInfo *)JavascriptArray::EntryInfo::Keys,0,(DynamicObject *)0x0,
                       (DynamicType *)0x0,0xcf);
      Memory::WriteBarrierPtr<Js::JavascriptFunction>::WriteBarrierSet
                (this_00,&ptr->super_JavascriptFunction);
    }
  }
  return this_00->ptr;
}

Assistant:

JavascriptFunction* JavascriptLibrary::EnsureArrayPrototypeKeysFunction()
    {
        if (arrayPrototypeKeysFunction == nullptr)
        {
#ifndef ENABLE_JS_BUILTINS
            arrayPrototypeKeysFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Keys, 0, nullptr, nullptr, PropertyIds::keys);
#else
            if (!scriptContext->IsJsBuiltInEnabled())
            {
                arrayPrototypeKeysFunction = DefaultCreateFunction(&JavascriptArray::EntryInfo::Keys, 0, nullptr, nullptr, PropertyIds::keys);
            }
            else
            {
                EnsureBuiltInEngineIsReady(JsBuiltInFile::Array_prototype, scriptContext);
            }
#endif
        }
        return arrayPrototypeKeysFunction;
    }